

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateFieldAccessor
               (FieldDescriptor *field,bool is_descriptor,Printer *printer)

{
  long lVar1;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  Descriptor *pDVar5;
  FieldDescriptor *this;
  FieldDescriptor *this_00;
  EnumDescriptor *pEVar6;
  int32 value;
  int32 extraout_EDX;
  int32 extraout_EDX_00;
  int32 value_00;
  char *pcVar7;
  string *this_01;
  string sStack_b8;
  string local_98;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  this_01 = &sStack_b8;
  lVar1 = *(long *)(field + 0x60);
  GenerateFieldDocComment(printer,field);
  if (lVar1 == 0) {
    UnderscoresToCamelCase(&sStack_b8,*(string **)field,true);
    io::Printer::Print(printer,
                       "public function get^camel_name^()\n{\n    return $this->^name^;\n}\n\n",
                       "camel_name",&sStack_b8,"name",*(string **)field);
  }
  else {
    UnderscoresToCamelCase(&sStack_b8,*(string **)field,true);
    IntToString_abi_cxx11_(&local_98,(php *)(ulong)*(uint *)(field + 0x38),value);
    io::Printer::Print(printer,
                       "public function get^camel_name^()\n{\n    return $this->readOneof(^number^);\n}\n\n"
                       ,"camel_name",&sStack_b8,"number",&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string((string *)&sStack_b8);
  GenerateFieldDocComment(printer,field);
  UnderscoresToCamelCase(&sStack_b8,*(string **)field,true);
  if (*(int *)(field + 0x4c) == 3) {
    pcVar7 = "&$var";
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(field);
    pcVar7 = "$var";
    if (CVar3 == CPPTYPE_MESSAGE) {
      pcVar7 = "&$var";
    }
  }
  std::__cxx11::string::string((string *)&local_98,pcVar7,(allocator *)&local_70);
  io::Printer::Print(printer,"public function set^camel_name^(^var^)\n{\n","camel_name",&sStack_b8,
                     "var",&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&sStack_b8);
  Indent(printer);
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    pDVar5 = FieldDescriptor::message_type(field);
    std::__cxx11::string::string((string *)&sStack_b8,"key",(allocator *)&local_98);
    this = Descriptor::FindFieldByName(pDVar5,&sStack_b8);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::string((string *)&sStack_b8,"value",(allocator *)&local_98);
    this_00 = Descriptor::FindFieldByName(pDVar5,&sStack_b8);
    std::__cxx11::string::~string((string *)&sStack_b8);
    pcVar7 = FieldDescriptor::type_name(this);
    std::__cxx11::string::string((string *)&local_98,pcVar7,&local_71);
    ToUpper(&sStack_b8,&local_98);
    pcVar7 = FieldDescriptor::type_name(this_00);
    std::__cxx11::string::string((string *)&local_50,pcVar7,&local_72);
    ToUpper(&local_70,&local_50);
    io::Printer::Print(printer,
                       "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
                       ,"key_type",&sStack_b8,"value_type",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
    CVar3 = FieldDescriptor::cpp_type(this_00);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pDVar5 = FieldDescriptor::message_type(this_00);
      FullClassName<google::protobuf::Descriptor>(&local_98,pDVar5,is_descriptor);
      std::operator+(&sStack_b8,&local_98,"::class");
      io::Printer::Print(printer,", \\^class_name^);\n","class_name",&sStack_b8);
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(this_00);
      if (CVar3 != CPPTYPE_ENUM) {
LAB_00263d2f:
        io::Printer::Print(printer,");\n");
        value_00 = extraout_EDX;
        goto LAB_00263de7;
      }
      pEVar6 = FieldDescriptor::enum_type(this_00);
      FullClassName<google::protobuf::EnumDescriptor>(&local_98,pEVar6,is_descriptor);
      std::operator+(&sStack_b8,&local_98,"::class");
      io::Printer::Print(printer,", \\^class_name^);\n","class_name",&sStack_b8);
    }
LAB_00263dd5:
    std::__cxx11::string::~string((string *)&sStack_b8);
    this_01 = &local_98;
  }
  else {
    if (*(int *)(field + 0x4c) == 3) {
      pcVar7 = FieldDescriptor::type_name(field);
      std::__cxx11::string::string((string *)&local_98,pcVar7,(allocator *)&local_70);
      ToUpper(&sStack_b8,&local_98);
      io::Printer::Print(printer,
                         "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^"
                         ,"type",&sStack_b8);
      std::__cxx11::string::~string((string *)&sStack_b8);
      std::__cxx11::string::~string((string *)&local_98);
      CVar3 = FieldDescriptor::cpp_type(field);
      if (CVar3 == CPPTYPE_MESSAGE) {
        pDVar5 = FieldDescriptor::message_type(field);
        FullClassName<google::protobuf::Descriptor>(&local_98,pDVar5,is_descriptor);
        std::operator+(&sStack_b8,&local_98,"::class");
        io::Printer::Print(printer,", \\^class_name^);\n","class_name",&sStack_b8);
      }
      else {
        CVar3 = FieldDescriptor::cpp_type(field);
        if (CVar3 != CPPTYPE_ENUM) goto LAB_00263d2f;
        pEVar6 = FieldDescriptor::enum_type(field);
        FullClassName<google::protobuf::EnumDescriptor>(&local_98,pEVar6,is_descriptor);
        std::operator+(&sStack_b8,&local_98,"::class");
        io::Printer::Print(printer,", \\^class_name^);\n","class_name",&sStack_b8);
      }
      goto LAB_00263dd5;
    }
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pDVar5 = FieldDescriptor::message_type(field);
      FullClassName<google::protobuf::Descriptor>(&sStack_b8,pDVar5,is_descriptor);
      io::Printer::Print(printer,"GPBUtil::checkMessage($var, \\^class_name^::class);\n",
                         "class_name",&sStack_b8);
      this_01 = &sStack_b8;
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(field);
      if (CVar3 == CPPTYPE_ENUM) {
        pEVar6 = FieldDescriptor::enum_type(field);
        FullClassName<google::protobuf::EnumDescriptor>(&sStack_b8,pEVar6,is_descriptor);
        io::Printer::Print(printer,"GPBUtil::checkEnum($var, \\^class_name^::class);\n","class_name"
                           ,&sStack_b8);
        this_01 = &sStack_b8;
      }
      else {
        CVar3 = FieldDescriptor::cpp_type(field);
        if (CVar3 != CPPTYPE_STRING) {
          pcVar7 = FieldDescriptor::cpp_type_name(field);
          std::__cxx11::string::string((string *)&local_98,pcVar7,(allocator *)&local_70);
          UnderscoresToCamelCase(&sStack_b8,&local_98,true);
          io::Printer::Print(printer,"GPBUtil::check^type^($var);\n","type",&sStack_b8);
          goto LAB_00263dd5;
        }
        TVar4 = FieldDescriptor::type(field);
        pcVar7 = "False";
        if (TVar4 == TYPE_STRING) {
          pcVar7 = "True";
        }
        std::__cxx11::string::string((string *)&sStack_b8,pcVar7,(allocator *)&local_98);
        io::Printer::Print(printer,"GPBUtil::checkString($var, ^utf8^);\n","utf8",&sStack_b8);
      }
    }
  }
  std::__cxx11::string::~string((string *)this_01);
  value_00 = extraout_EDX_00;
LAB_00263de7:
  if (lVar1 == 0) {
    if (*(int *)(field + 0x4c) == 3) {
      pcVar7 = "$this->^name^ = $arr;\n";
    }
    else {
      pcVar7 = "$this->^name^ = $var;\n";
    }
    io::Printer::Print(printer,pcVar7,"name",*(string **)field);
  }
  else {
    IntToString_abi_cxx11_(&sStack_b8,(php *)(ulong)*(uint *)(field + 0x38),value_00);
    io::Printer::Print(printer,"$this->writeOneof(^number^, $var);\n","number",&sStack_b8);
    std::__cxx11::string::~string((string *)&sStack_b8);
  }
  if (is_descriptor) {
    io::Printer::Print(printer,"$this->has_^field_name^ = true;\n","field_name",*(string **)field);
    Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
    UnderscoresToCamelCase(&sStack_b8,*(string **)field,true);
    io::Printer::Print(printer,
                       "public function has^camel_name^()\n{\n    return $this->has_^field_name^;\n}\n\n"
                       ,"camel_name",&sStack_b8,"field_name",*(string **)field);
    std::__cxx11::string::~string((string *)&sStack_b8);
  }
  else {
    Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
  }
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, bool is_descriptor,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->containing_oneof();

  // Generate getter.
  if (oneof != NULL) {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "number", IntToString(field->number()));
  } else {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name());
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field);
  printer->Print(
      "public function set^camel_name^(^var^)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true),
      "var", (field->is_repeated() ||
              field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) ?
             "&$var": "$var");

  Indent(printer);

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->FindFieldByName("key");
    const FieldDescriptor* value = map_entry->FindFieldByName("value");
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", ToUpper(key->type_name()),
        "value_type", ToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->message_type(), is_descriptor) + "::class");
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", ToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->message_type(), is_descriptor) + "::class");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print(
        "GPBUtil::checkMessage($var, \\^class_name^::class);\n",
        "class_name", FullClassName(field->message_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print(
        "GPBUtil::checkEnum($var, \\^class_name^::class);\n",
        "class_name", FullClassName(field->enum_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n",
        "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True": "False");
  } else {
    printer->Print(
        "GPBUtil::check^type^($var);\n",
        "type", UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (oneof != NULL) {
    printer->Print(
        "$this->writeOneof(^number^, $var);\n",
        "number", IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print(
        "$this->^name^ = $arr;\n",
        "name", field->name());
  } else {
    printer->Print(
        "$this->^name^ = $var;\n",
        "name", field->name());
  }

  // Set has bit for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "$this->has_^field_name^ = true;\n",
        "field_name", field->name());
  }

  Outdent(printer);

  printer->Print(
      "}\n\n");

  // Generate has method for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    return $this->has_^field_name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "field_name", field->name());
  }
}